

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

void __thiscall
AutoCodeGenPhase::EndPhase
          (AutoCodeGenPhase *this,Func *func,Phase phase,bool dump,bool isPhaseComplete)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  byte local_2a;
  byte local_29;
  bool isPhaseComplete_local;
  bool dump_local;
  Phase phase_local;
  Func *func_local;
  AutoCodeGenPhase *this_local;
  
  if (this->func != func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x481,"(this->func == func)","this->func == func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->phase != phase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x482,"(this->phase == phase)","this->phase == phase");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_29 = 0;
  if (dump) {
    sourceContextId = Func::GetSourceContextId(func);
    functionId = Func::GetLocalFunctionId(func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,SimpleJitPhase,sourceContextId,functionId)
    ;
    local_2a = 1;
    if (!bVar2) {
      bVar2 = Func::IsSimpleJit(func);
      local_2a = bVar2 ^ 0xff;
    }
    local_29 = local_2a;
  }
  this->dump = (bool)(local_29 & 1);
  this->isPhaseComplete = isPhaseComplete;
  return;
}

Assistant:

void EndPhase(Func * func, Js::Phase phase, bool dump, bool isPhaseComplete)
    {
        Assert(this->func == func);
        Assert(this->phase == phase);
        this->dump = dump && (PHASE_DUMP(Js::SimpleJitPhase, func) || !func->IsSimpleJit());
        this->isPhaseComplete = isPhaseComplete;
    }